

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O1

char * dict_to_string(ObjDict *dict)

{
  HTKeyType HVar1;
  HTItem *pHVar2;
  void *__src;
  bool bVar3;
  String *pSVar4;
  char *pcVar5;
  size_t length;
  ulong uVar6;
  long lVar7;
  char *unaff_R13;
  char *key;
  long lVar8;
  long lVar9;
  CrispyValue value;
  StringArray str_arr;
  char *val;
  StringArray local_68;
  HTItem **local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  char *local_38;
  
  HVar1 = (dict->content).key_type;
  local_50 = (ulong)(dict->content).cap;
  local_58 = (dict->content).buckets;
  local_68.count = 0;
  local_68.cap = 0;
  local_68.strings = (String *)0x0;
  if (local_50 == 0) {
    lVar9 = 0;
  }
  else {
    bVar3 = true;
    local_40 = (ulong)HVar1;
    uVar6 = 0;
    lVar9 = 0;
    do {
      local_48 = uVar6;
      for (pHVar2 = local_58[uVar6]; pHVar2 != (HTItem *)0x0; pHVar2 = pHVar2->next) {
        if (bVar3) {
          pcVar5 = strdup("\"");
          lVar8 = 1;
          write_string(&local_68,pcVar5,1);
          bVar3 = false;
        }
        else {
          pcVar5 = strdup(", \"");
          lVar8 = 3;
          write_string(&local_68,pcVar5,3);
        }
        if (HVar1 < 4) {
          pcVar5 = (char *)(*(code *)(&DAT_001093a8 + *(int *)(&DAT_001093a8 + local_40 * 4)))();
          return pcVar5;
        }
        write_string(&local_68,unaff_R13,0);
        pcVar5 = strdup("\": ");
        write_string(&local_68,pcVar5,3);
        value._4_4_ = 0;
        value.type = (pHVar2->value).type;
        value.field_1.p_value = (pHVar2->value).field_1.p_value;
        length = value_to_string(value,&local_38);
        write_string(&local_68,local_38,length);
        lVar9 = lVar9 + lVar8 + length + 3;
      }
      uVar6 = local_48 + 1;
    } while (uVar6 != local_50);
  }
  pcVar5 = (char *)malloc(lVar9 + 3);
  pSVar4 = local_68.strings;
  uVar6 = local_68._0_8_ & 0xffffffff;
  if (uVar6 != 0) {
    lVar7 = 1;
    lVar8 = 0;
    do {
      __src = *(void **)((long)&pSVar4->start + lVar8);
      memcpy(pcVar5 + lVar7,__src,*(size_t *)((long)&pSVar4->length + lVar8));
      free(__src);
      lVar7 = lVar7 + *(long *)((long)&pSVar4->length + lVar8);
      lVar8 = lVar8 + 0x10;
    } while (uVar6 << 4 != lVar8);
  }
  *pcVar5 = '{';
  (pcVar5 + lVar9 + 1)[0] = '}';
  (pcVar5 + lVar9 + 1)[1] = '\0';
  reallocate(local_68.strings,0);
  return pcVar5;
}

Assistant:

char *dict_to_string(ObjDict *dict) {
    HashTable ht = dict->content;
    StringArray str_arr;
    init_string_array(&str_arr);

    size_t size = 0;
    size_t temp_size;

    bool first = true;

    for (uint32_t i = 0; i < ht.cap; ++i) {
        HTItem *bucket = ht.buckets[i];
        while (bucket) {
            if (first) {
                first = false;
                write_string(&str_arr, strdup("\""), 1);
                size += 1;
            } else {
                write_string(&str_arr, strdup(", \""), 3);
                size += 3;
            }

            char *key;
            temp_size = ht_key_to_string(ht.key_type, bucket->key, &key);
            write_string(&str_arr, key, temp_size);
            size += temp_size;

            size += 3;
            write_string(&str_arr, strdup("\": "), 3);

            char *val;
            temp_size = value_to_string(bucket->value, &val);
            write_string(&str_arr, val, temp_size);
            size += temp_size;

            bucket = bucket->next;
        }
    }

    char *string = malloc((size + 3)* sizeof(char));
    size_t offset = 1;

    for (uint32_t j = 0; j < str_arr.count; ++j) {
        String *s = &str_arr.strings[j];
        memcpy(string + offset, s->start, s->length);
        free(str_arr.strings[j].start);
        offset += s->length;
    }

    string[0] = '{';
    string[size + 1] = '}';
    string[size + 2] = '\0';

    free_string_array(&str_arr);

    return string;
}